

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

void __thiscall pbrt::SquareMatrix<2>::SquareMatrix(SquareMatrix<2> *this,Float (*mat) [2])

{
  int j;
  int i;
  Float (*mat_local) [2];
  SquareMatrix<2> *this_local;
  
  for (i = 0; i < 2; i = i + 1) {
    for (j = 0; j < 2; j = j + 1) {
      this->m[i][j] = mat[i][j];
    }
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    SquareMatrix(const Float mat[N][N]) {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                m[i][j] = mat[i][j];
    }